

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match64_inc.h
# Opt level: O2

void InitializeH6(HasherCommon *common,H6 *self,BrotliEncoderParams *params)

{
  int iVar1;
  uint16_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  
  self->common_ = common;
  iVar1 = (common->params).bucket_bits;
  self->hash_shift_ = 0x40 - iVar1;
  self->hash_mask_ = 0xffffffffffffffff >> ((char)(common->params).hash_len * -8 & 0x3fU);
  sVar4 = 1L << ((byte)iVar1 & 0x3f);
  self->bucket_size_ = sVar4;
  iVar1 = (common->params).block_bits;
  self->block_bits_ = iVar1;
  sVar3 = 1L << ((byte)iVar1 & 0x3f);
  self->block_size_ = sVar3;
  self->block_mask_ = (int)sVar3 - 1;
  self->num_last_distances_to_check_ = (common->params).num_last_distances_to_check;
  puVar2 = (uint16_t *)common->extra;
  self->num_ = puVar2;
  self->buckets_ = (uint32_t *)(puVar2 + sVar4);
  return;
}

Assistant:

static void FN(Initialize)(
    HasherCommon* common, HashLongestMatch* BROTLI_RESTRICT self,
    const BrotliEncoderParams* params) {
  self->common_ = common;

  BROTLI_UNUSED(params);
  self->hash_shift_ = 64 - common->params.bucket_bits;
  self->hash_mask_ = (~((uint64_t)0U)) >> (64 - 8 * common->params.hash_len);
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_bits_ = common->params.block_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
  self->num_last_distances_to_check_ =
      common->params.num_last_distances_to_check;
  self->num_ = (uint16_t*)common->extra;
  self->buckets_ = (uint32_t*)&self->num_[self->bucket_size_];
}